

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::drop_all_pending_commit_elems(raft_server *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Base_ptr this_00;
  undefined8 uVar3;
  element_type *peVar4;
  int iVar5;
  _Node *p_Var6;
  _Base_ptr p_Var7;
  uint64_t uVar8;
  _Rb_tree_node_base *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  element_type *peVar11;
  element_type *peVar12;
  ptr<buffer> result;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  elems;
  undefined1 local_99;
  undefined1 local_98 [40];
  _List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  local_70;
  runtime_error *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<std::exception> local_48;
  element_type *local_38;
  
  context::get_params((context *)local_98);
  iVar5 = *(int *)&((element_type *)(local_98._0_8_ + 0x58))->_vptr_state_mgr;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if (iVar5 == 0) {
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    peVar12 = (element_type *)0xffffffffffffffff;
    p_Var9 = (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_98._32_8_ = &this->commit_ret_elems_lock_;
    peVar4 = (element_type *)0x0;
    while ((_Rb_tree_header *)p_Var9 !=
           &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header) {
      p_Var7 = p_Var9[1]._M_parent;
      p_Var7[5]._M_parent = (_Base_ptr)0x0;
      this_00 = p_Var7[5]._M_left;
      p_Var7[5]._M_left = (_Base_ptr)0x0;
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      p_Var7 = p_Var9[1]._M_parent;
      *(undefined4 *)&p_Var7[5]._M_right = 0xffffffff;
      EventAwaiter::invoke((EventAwaiter *)&p_Var7->_M_parent);
      peVar11 = *(element_type **)p_Var9[1]._M_parent;
      if (peVar11 <= peVar12) {
        peVar12 = peVar11;
      }
      if (peVar11 < peVar4) {
        peVar11 = peVar4;
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar5 = (*peVar2->_vptr_logger[7])(), 4 < iVar5)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar3 = *(undefined8 *)p_Var9[1]._M_parent;
        local_38 = peVar12;
        uVar8 = timer_helper::get_us((timer_helper *)&p_Var9[1]._M_parent[3]._M_parent);
        msg_if_given_abi_cxx11_
                  ((string *)local_98,"cancelled blocking client request %lu, waited %lu us",uVar3,
                   uVar8);
        (*peVar2->_vptr_logger[8])
                  (peVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"drop_all_pending_commit_elems",0x119,(string *)local_98);
        peVar12 = local_38;
        if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
          peVar12 = local_38;
        }
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      peVar4 = peVar11;
    }
    if ((((this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
        (peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar2 != (element_type *)0x0)) && (iVar5 = (*peVar2->_vptr_logger[7])(), 2 < iVar5)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_98,"cancelled %zu blocking client requests from %lu to %lu.",
                 (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count,peVar12,
                 peVar4);
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                 ,"drop_all_pending_commit_elems",0x11e,local_98);
      if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::clear(&(this->commit_ret_elems_)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)local_98._32_8_);
  }
  else {
    local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
    local_70._M_impl._M_node._M_size = 0;
    local_70._M_impl._M_node.super__List_node_base._M_prev =
         local_70._M_impl._M_node.super__List_node_base._M_next;
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    p_Var7 = (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      do {
        p_Var6 = std::__cxx11::
                 list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                 ::_M_create_node<std::shared_ptr<nuraft::raft_server::commit_ret_elem>const&>
                           ((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                             *)&local_70,
                            (shared_ptr<nuraft::raft_server::commit_ret_elem> *)&p_Var7[1]._M_parent
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        local_70._M_impl._M_node._M_size = (long)(_func_int ***)local_70._M_impl._M_node._M_size + 1
        ;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::clear(&(this->commit_ret_elems_)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_70._M_impl._M_node.super__List_node_base._M_next !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_70) {
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_70._M_impl._M_node.super__List_node_base._M_next;
      do {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar5 = (*peVar2->_vptr_logger[7])(), 2 < iVar5)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_98,"cancelled non-blocking client request %lu",
                     ((_List_node_base *)p_Var10[1]._vptr__Sp_counted_base)->_M_next);
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"drop_all_pending_commit_elems",0x133,(string *)local_98);
          if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_);
          }
        }
        local_98._0_8_ = (element_type *)0x0;
        local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58 = (runtime_error *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::runtime_error,std::allocator<std::runtime_error>,char_const(&)[19]>
                  (&_Stack_50,&local_58,(allocator<std::runtime_error> *)&local_99,
                   (char (*) [19])"Request cancelled.");
        local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_58;
        local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Stack_50._M_pi;
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
                  ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                   ((_List_node_base *)p_Var10[1]._vptr__Sp_counted_base)[0xc]._M_next,
                   (shared_ptr<nuraft::buffer> *)local_98,&local_48,CANCELLED);
        if (local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((_List_impl *)&p_Var10->_vptr__Sp_counted_base)->_M_node).super__List_node_base.
                  _M_next;
      } while (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_70);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ::_M_clear(&local_70);
  }
  return;
}

Assistant:

void raft_server::drop_all_pending_commit_elems() {
    // Blocking mode:
    //   Invoke all awaiting requests to return `CANCELLED`.
    if (ctx_->get_params()->return_method_ == raft_params::blocking) {
        auto_lock(commit_ret_elems_lock_);
        ulong min_idx = std::numeric_limits<ulong>::max();
        ulong max_idx = 0;
        for (auto& entry: commit_ret_elems_) {
            ptr<commit_ret_elem>& elem = entry.second;
            elem->ret_value_ = nullptr;
            elem->result_code_ = cmd_result_code::CANCELLED;
            elem->awaiter_.invoke();
            if (min_idx > elem->idx_) {
                min_idx = elem->idx_;
            }
            if (max_idx < elem->idx_) {
                max_idx = elem->idx_;
            }
            p_db("cancelled blocking client request %" PRIu64 ", waited %" PRIu64 " us",
                 elem->idx_, elem->timer_.get_us());
        }
        if (!commit_ret_elems_.empty()) {
            p_wn("cancelled %zu blocking client requests from %" PRIu64
                 " to %" PRIu64 ".",
                 commit_ret_elems_.size(), min_idx, max_idx);
        }
        commit_ret_elems_.clear();
        return;
    }

    // Non-blocking mode:
    //   Set `CANCELLED` and set result & error.
    std::list< ptr<commit_ret_elem> > elems;

    {   auto_lock(commit_ret_elems_lock_);
        for (auto& entry: commit_ret_elems_) {
            ptr<commit_ret_elem>& ee = entry.second;
            elems.push_back(ee);
        }
        commit_ret_elems_.clear();
    }

    // Calling handler should be done outside the mutex.
    for (auto& entry: elems) {
        ptr<commit_ret_elem>&ee = entry;
        p_wn("cancelled non-blocking client request %" PRIu64, ee->idx_);

        ptr<buffer> result = nullptr;
        ptr<std::exception> err =
            cs_new<std::runtime_error>("Request cancelled.");
        ee->async_result_->set_result(result, err, cmd_result_code::CANCELLED);
    }
}